

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::set_nonblocking(socket_t sock,bool nonblocking)

{
  undefined4 local_1c;
  int flags;
  bool nonblocking_local;
  socket_t sock_local;
  
  local_1c = fcntl(sock,3,0);
  if (nonblocking) {
    local_1c = local_1c | 0x800;
  }
  else {
    local_1c = local_1c & 0xfffff7ff;
  }
  fcntl(sock,4,(ulong)local_1c);
  return;
}

Assistant:

inline void set_nonblocking(socket_t sock, bool nonblocking) {
#ifdef _WIN32
			auto flags = nonblocking ? 1UL : 0UL;
  ioctlsocket(sock, FIONBIO, &flags);
#else
			auto flags = fcntl(sock, F_GETFL, 0);
			fcntl(sock, F_SETFL,
				  nonblocking ? (flags | O_NONBLOCK) : (flags & (~O_NONBLOCK)));
#endif
		}